

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O3

int Cec_ManSimClassRefineOne(Cec_ManSim_t *p,int i)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  uint *puVar4;
  int iVar5;
  Gia_Man_t *pGVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint *puVar10;
  
  pVVar2 = p->vClassOld;
  pVVar3 = p->vClassNew;
  pVVar2->nSize = 0;
  pVVar3->nSize = 0;
  Vec_IntPush(pVVar2,i);
  lVar7 = (long)i;
  pGVar6 = p->pAig;
  if ((~(uint)pGVar6->pReprs[lVar7] & 0xfffffff) == 0) {
    puVar10 = p->pMems + p->pSimInfo[lVar7];
    iVar9 = 0;
    do {
      iVar8 = pGVar6->pNexts[lVar7];
      if (iVar8 < 1) break;
      do {
        puVar4 = p->pMems;
        iVar1 = p->pSimInfo[iVar8];
        iVar5 = Cec_ManSimCompareEqual(puVar10 + 1,puVar4 + (long)iVar1 + 1,p->nWords);
        if (iVar5 == 0) {
          Vec_IntPush(p->vClassNew,iVar8);
          if (p->pBestState != (Abc_Cex_t *)0x0) {
            Cec_ManSimCompareEqualScore(puVar10 + 1,puVar4 + (long)iVar1 + 1,p->nWords,p->pScores);
          }
        }
        else {
          Vec_IntPush(p->vClassOld,iVar8);
        }
        iVar8 = p->pAig->pNexts[iVar8];
      } while (iVar8 != 0);
      if (p->vClassNew->nSize == 0) {
        iVar8 = 0;
LAB_005ca703:
        return iVar8 + iVar9;
      }
      Cec_ManSimClassCreate(p->pAig,p->vClassOld);
      Cec_ManSimClassCreate(p->pAig,p->vClassNew);
      pVVar2 = p->vClassNew;
      if (pVVar2->nSize < 2) {
        iVar8 = 1;
        goto LAB_005ca703;
      }
      iVar8 = *pVVar2->pArray;
      iVar9 = iVar9 + 1;
      pVVar3 = p->vClassOld;
      pVVar3->nSize = 0;
      pVVar2->nSize = 0;
      Vec_IntPush(pVVar3,iVar8);
      pGVar6 = p->pAig;
      lVar7 = (long)iVar8;
      puVar10 = p->pMems + p->pSimInfo[lVar7];
    } while ((~(uint)pGVar6->pReprs[lVar7] & 0xfffffff) == 0);
  }
  __assert_fail("Gia_ObjIsHead(p->pAig, i)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                ,0x114,"int Cec_ManSimClassRefineOne(Cec_ManSim_t *, int)");
}

Assistant:

int Cec_ManSimClassRefineOne( Cec_ManSim_t * p, int i )
{
    unsigned * pSim0, * pSim1;
    int Ent;
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Vec_IntPush( p->vClassOld, i );
    pSim0 = Cec_ObjSim(p, i);
    Gia_ClassForEachObj1( p->pAig, i, Ent )
    {
        pSim1 = Cec_ObjSim(p, Ent);
        if ( Cec_ManSimCompareEqual( pSim0, pSim1, p->nWords ) )
            Vec_IntPush( p->vClassOld, Ent );
        else
        {
            Vec_IntPush( p->vClassNew, Ent );
            if ( p->pBestState )
                Cec_ManSimCompareEqualScore( pSim0, pSim1, p->nWords, p->pScores );
        }
    }
    if ( Vec_IntSize( p->vClassNew ) == 0 )
        return 0;
    Cec_ManSimClassCreate( p->pAig, p->vClassOld );
    Cec_ManSimClassCreate( p->pAig, p->vClassNew );
    if ( Vec_IntSize(p->vClassNew) > 1 )
        return 1 + Cec_ManSimClassRefineOne( p, Vec_IntEntry(p->vClassNew,0) );
    return 1;
}